

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool __thiscall
tinyusdz::Xformable::EvaluateXformOps
          (Xformable *this,double t,TimeSampleInterpolationType tinterp,matrix4d *out_matrix,
          bool *resetXformStack,string *err)

{
  matrix4d *this_00;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  value_type *__src;
  value_type *__src_00;
  value_type *pvVar5;
  reference pvVar6;
  value_type *pvVar7;
  reference pvVar8;
  value_type *pvVar9;
  reference pvVar10;
  optional<std::array<tinyusdz::value::half,_3UL>_> *poVar11;
  value_type *pvVar12;
  value_type_conflict2 *pvVar13;
  value_type *pvVar14;
  value_type *q;
  value_type *q_00;
  value_type *q_01;
  ulong uVar15;
  error_type *peVar16;
  value_type *pvVar17;
  uint *args;
  float fVar18;
  matrix4d local_ef8;
  undefined1 local_e78 [8];
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_3;
  matrix4d local_dd8;
  allocator local_d51;
  string local_d50 [32];
  string local_d30;
  undefined1 local_d10 [8];
  matrix3d inv_rm;
  string local_cc0 [32];
  string local_ca0;
  matrix3d local_c80;
  optional<tinyusdz::value::quatd> local_c38;
  undefined1 local_c10 [8];
  optional<tinyusdz::value::quatd> d_3;
  optional<tinyusdz::value::quatf> local_ba0;
  undefined1 local_b8c [8];
  optional<tinyusdz::value::quatf> f_3;
  optional<tinyusdz::value::quath> local_b2c;
  undefined1 local_b22 [8];
  optional<tinyusdz::value::quath> h_3;
  matrix3d rm;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_2;
  XformEvaluator xe_2;
  string local_9a0 [32];
  string local_980;
  optional<double> local_960;
  undefined1 local_950 [8];
  optional<double> d_2;
  optional<float> local_934;
  optional<float> f_2;
  optional<tinyusdz::value::half> local_924;
  value_type vStack_920;
  optional<tinyusdz::value::half> h_2;
  double angle_2;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_1;
  XformEvaluator xe_1;
  string local_7e8 [32];
  string local_7c8;
  optional<double> local_7a8;
  undefined1 local_798 [8];
  optional<double> d_1;
  optional<float> local_77c;
  optional<float> f_1;
  optional<tinyusdz::value::half> local_76c;
  value_type vStack_768;
  optional<tinyusdz::value::half> h_1;
  double angle_1;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  XformEvaluator xe;
  string local_630 [32];
  string local_610;
  optional<double> local_5f0;
  undefined1 local_5e0 [8];
  optional<double> d;
  optional<float> local_5c4;
  optional<float> f;
  optional<tinyusdz::value::half> local_5b4;
  value_type vStack_5b0;
  optional<tinyusdz::value::half> h;
  double angle;
  undefined1 local_588 [8];
  optional<std::array<double,_3UL>_> txd;
  undefined1 local_558 [8];
  optional<std::array<float,_3UL>_> txf;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_540;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_538;
  optional<std::array<tinyusdz::value::half,_3UL>_> txh;
  double tz;
  double ty;
  double tx;
  undefined1 local_4f8 [8];
  optional<std::array<double,_3UL>_> sxd_1;
  undefined1 local_4c8 [8];
  optional<std::array<float,_3UL>_> sxf_1;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_4b0;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_4a8;
  optional<std::array<tinyusdz::value::half,_3UL>_> sxh;
  double sz;
  double sy;
  double sx;
  allocator local_401;
  string local_400 [32];
  string local_3e0;
  double local_3c0;
  double det;
  undefined1 local_330 [8];
  optional<tinyusdz::value::matrix4d> sxd;
  size_t k;
  size_t j;
  matrix4f mf;
  undefined1 local_210 [8];
  optional<tinyusdz::value::matrix4f> sxf;
  matrix4d m;
  value_type x;
  size_t i;
  matrix4d cm;
  anon_class_16_2_171125bd RotateABC;
  string *err_local;
  bool *resetXformStack_local;
  matrix4d *out_matrix_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  Xformable *this_local;
  
  cm.m[3][3] = t;
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)&i);
  Identity((matrix4d *)&i);
  x._is_blocked = false;
  x._105_7_ = 0;
  for (; uVar1 = x._104_8_,
      sVar3 = std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                        (&this->xformOps), (ulong)uVar1 < sVar3; x._104_8_ = x._104_8_ + 1) {
    pvVar4 = std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::operator[]
                       (&this->xformOps,x._104_8_);
    XformOp::XformOp((XformOp *)(m.m[3] + 3),pvVar4);
    this_00 = (matrix4d *)((long)&sxf.contained + 0x3c);
    tinyusdz::value::matrix4d::matrix4d(this_00);
    Identity(this_00);
    args = &switchD_0024941b::switchdataD_002daca0;
    switch(m.m[3][3]._0_4_) {
    case 0:
      XformOp::get_value<tinyusdz::value::matrix4f>
                ((optional<tinyusdz::value::matrix4f> *)(mf.m[3] + 2),(XformOp *)(m.m[3] + 3),t,
                 tinterp);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::
      optional<tinyusdz::value::matrix4f,_0>
                ((optional<tinyusdz::value::matrix4f> *)local_210,
                 (optional<tinyusdz::value::matrix4f> *)(mf.m[3] + 2));
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional
                ((optional<tinyusdz::value::matrix4f> *)(mf.m[3] + 2));
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_210);
      if (bVar2) {
        __src = nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::value
                          ((optional<tinyusdz::value::matrix4f> *)local_210);
        memcpy((void *)((long)&j + 4),__src,0x40);
        for (k = 0; k < 4; k = k + 1) {
          for (sxd.contained._120_8_ = 0; (ulong)sxd.contained._120_8_ < 4;
              sxd.contained._120_8_ = sxd.contained._120_8_ + 1) {
            *(double *)((long)&sxf.contained + sxd.contained._120_8_ * 8 + k * 0x20 + 0x3c) =
                 (double)*(float *)((long)&j + sxd.contained._120_8_ * 4 + k * 0x10 + 4);
            args = (uint *)sxd.contained._120_8_;
          }
        }
LAB_00249632:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<tinyusdz::value::matrix4d>
                  ((optional<tinyusdz::value::matrix4d> *)&det,(XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
        optional<tinyusdz::value::matrix4d,_0>
                  ((optional<tinyusdz::value::matrix4d> *)local_330,
                   (optional<tinyusdz::value::matrix4d> *)&det);
        nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                  ((optional<tinyusdz::value::matrix4d> *)&det);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_330);
        if (bVar2) {
          __src_00 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                               ((optional<tinyusdz::value::matrix4d> *)local_330);
          memcpy((void *)((long)&sxf.contained + 0x3c),__src_00,0x80);
          sxf.contained._56_4_ = 0;
        }
        else {
          if (err != (string *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)err,"`xformOp:transform` is not matrix4f or matrix4d type.\n");
          }
          this_local._7_1_ = 0;
          sxf.contained._56_4_ = 1;
        }
        nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                  ((optional<tinyusdz::value::matrix4d> *)local_330);
        if (sxf.contained._56_4_ == 0) goto LAB_00249632;
      }
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional
                ((optional<tinyusdz::value::matrix4f> *)local_210);
      if (sxf.contained._56_4_ == 0) {
        if ((m.m[3][3]._4_1_ & 1) != 0) {
          local_3c0 = determinant((matrix4d *)((long)&sxf.contained + 0x3c));
          if (ABS(local_3c0) < 1e-09) {
            if (err != (string *)0x0) {
              uVar15 = std::__cxx11::string::empty();
              if ((uVar15 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_400,
                           "`xformOp:transform:{}` is singular matrix and cannot be inverted.\n",
                           &local_401);
                fmt::format<std::__cxx11::string>
                          (&local_3e0,(fmt *)local_400,(string *)&x,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                std::__cxx11::string::operator+=((string *)err,(string *)&local_3e0);
                std::__cxx11::string::~string((string *)&local_3e0);
                std::__cxx11::string::~string(local_400);
                std::allocator<char>::~allocator((allocator<char> *)&local_401);
              }
              else {
                std::__cxx11::string::operator+=
                          ((string *)err,
                           "`xformOp:transform` is singular matrix and cannot be inverted.\n");
              }
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
            break;
          }
          inverse((matrix4d *)&sx,(matrix4d *)((long)&sxf.contained + 0x3c));
          memcpy((void *)((long)&sxf.contained + 0x3c),&sx,0x80);
        }
        goto switchD_0024941b_default;
      }
      break;
    case 1:
      XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                (&local_540,(XformOp *)(m.m[3] + 3),t,tinterp);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>(&local_538,&local_540);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_540);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_538);
      if (bVar2) {
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_538);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,0);
        txf.contained._10_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)txf.contained._10_2_);
        ty = (double)fVar18;
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_538);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,1);
        txf.contained._8_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)txf.contained._8_2_);
        tz = (double)fVar18;
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_538);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,2);
        txf.contained._6_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)txf.contained._6_2_);
        txh = (optional<std::array<tinyusdz::value::half,_3UL>_>)(double)fVar18;
LAB_00249e2e:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)((long)&txd.contained + 0x10),
                   (XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::
        optional<std::array<float,_3UL>,_0>
                  ((optional<std::array<float,_3UL>_> *)local_558,
                   (optional<std::array<float,_3UL>_> *)((long)&txd.contained + 0x10));
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                  ((optional<std::array<float,_3UL>_> *)((long)&txd.contained + 0x10));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_558);
        if (bVar2) {
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_558);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,0);
          ty = (double)*pvVar8;
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_558);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,1);
          tz = (double)*pvVar8;
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_558);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,2);
          txh = (optional<std::array<tinyusdz::value::half,_3UL>_>)(double)*pvVar8;
LAB_00249e0a:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)&angle,(XformOp *)(m.m[3] + 3),t,tinterp)
          ;
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::
          optional<std::array<double,_3UL>,_0>
                    ((optional<std::array<double,_3UL>_> *)local_588,
                     (optional<std::array<double,_3UL>_> *)&angle);
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                    ((optional<std::array<double,_3UL>_> *)&angle);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_588);
          if (bVar2) {
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_588);
            pvVar10 = std::array<double,_3UL>::operator[](pvVar9,0);
            ty = *pvVar10;
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_588);
            pvVar10 = std::array<double,_3UL>::operator[](pvVar9,1);
            tz = *pvVar10;
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_588);
            poVar11 = (optional<std::array<tinyusdz::value::half,_3UL>_> *)
                      std::array<double,_3UL>::operator[](pvVar9,2);
            txh = *poVar11;
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)err,"`xformOp:translate` is not half3, float3 or double3 type.\n"
                        );
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                    ((optional<std::array<double,_3UL>_> *)local_588);
          if (sxf.contained._56_4_ == 0) goto LAB_00249e0a;
        }
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                  ((optional<std::array<float,_3UL>_> *)local_558);
        if (sxf.contained._56_4_ == 0) goto LAB_00249e2e;
      }
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_538);
      if (sxf.contained._56_4_ == 0) {
        if ((m.m[3][3]._4_1_ & 1) != 0) {
          ty = -ty;
          tz = -tz;
          txh = (optional<std::array<tinyusdz::value::half,_3UL>_>)((ulong)txh ^ 0x8000000000000000)
          ;
        }
        m.m[2][3] = ty;
        m.m[3][0] = tz;
        m.m[3][1] = (double)txh;
        goto switchD_0024941b_default;
      }
      break;
    case 2:
      XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                (&local_4b0,(XformOp *)(m.m[3] + 3),t,tinterp);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>(&local_4a8,&local_4b0);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_4b0);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_4a8);
      if (bVar2) {
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_4a8);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,0);
        sxf_1.contained._10_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)sxf_1.contained._10_2_);
        sy = (double)fVar18;
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_4a8);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,1);
        sxf_1.contained._8_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)sxf_1.contained._8_2_);
        sz = (double)fVar18;
        pvVar5 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_4a8);
        pvVar6 = std::array<tinyusdz::value::half,_3UL>::operator[](pvVar5,2);
        sxf_1.contained._6_2_ = pvVar6->value;
        fVar18 = tinyusdz::value::half_to_float((half)sxf_1.contained._6_2_);
        sxh = (optional<std::array<tinyusdz::value::half,_3UL>_>)(double)fVar18;
LAB_00249a88:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)((long)&sxd_1.contained + 0x10),
                   (XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::
        optional<std::array<float,_3UL>,_0>
                  ((optional<std::array<float,_3UL>_> *)local_4c8,
                   (optional<std::array<float,_3UL>_> *)((long)&sxd_1.contained + 0x10));
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                  ((optional<std::array<float,_3UL>_> *)((long)&sxd_1.contained + 0x10));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c8);
        if (bVar2) {
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_4c8);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,0);
          sy = (double)*pvVar8;
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_4c8);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,1);
          sz = (double)*pvVar8;
          pvVar7 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                             ((optional<std::array<float,_3UL>_> *)local_4c8);
          pvVar8 = std::array<float,_3UL>::operator[](pvVar7,2);
          sxh = (optional<std::array<tinyusdz::value::half,_3UL>_>)(double)*pvVar8;
LAB_00249a64:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)&tx,(XformOp *)(m.m[3] + 3),t,tinterp);
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::
          optional<std::array<double,_3UL>,_0>
                    ((optional<std::array<double,_3UL>_> *)local_4f8,
                     (optional<std::array<double,_3UL>_> *)&tx);
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                    ((optional<std::array<double,_3UL>_> *)&tx);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4f8);
          if (bVar2) {
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_4f8);
            pvVar10 = std::array<double,_3UL>::operator[](pvVar9,0);
            sy = *pvVar10;
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_4f8);
            pvVar10 = std::array<double,_3UL>::operator[](pvVar9,1);
            sz = *pvVar10;
            pvVar9 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                               ((optional<std::array<double,_3UL>_> *)local_4f8);
            poVar11 = (optional<std::array<tinyusdz::value::half,_3UL>_> *)
                      std::array<double,_3UL>::operator[](pvVar9,2);
            sxh = *poVar11;
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)err,"`xformOp:scale` is not half3, float3 or double3 type.\n");
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
                    ((optional<std::array<double,_3UL>_> *)local_4f8);
          if (sxf.contained._56_4_ == 0) goto LAB_00249a64;
        }
        nonstd::optional_lite::optional<std::array<float,_3UL>_>::~optional
                  ((optional<std::array<float,_3UL>_> *)local_4c8);
        if (sxf.contained._56_4_ == 0) goto LAB_00249a88;
      }
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_4a8);
      if (sxf.contained._56_4_ == 0) {
        if ((m.m[3][3]._4_1_ & 1) != 0) {
          sy = 1.0 / sy;
          sz = 1.0 / sz;
          sxh = (optional<std::array<tinyusdz::value::half,_3UL>_>)(1.0 / (double)sxh);
        }
        stack0xfffffffffffffe38 = sy;
        m.m[1][0] = sz;
        m.m[2][1] = (double)sxh;
        goto switchD_0024941b_default;
      }
      break;
    case 3:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&f.contained,(XformOp *)(m.m[3] + 3),t,tinterp);
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_5b4,(optional<tinyusdz::value::half> *)&f.contained);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional
                ((optional<tinyusdz::value::half> *)&f.contained);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_5b4);
      if (bVar2) {
        pvVar12 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_5b4);
        f._2_2_ = pvVar12->value;
        fVar18 = tinyusdz::value::half_to_float((half)f._2_2_);
        vStack_5b0 = (value_type)fVar18;
LAB_0024a161:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<float>
                  ((optional<float> *)((long)&d.contained + 4),(XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<float>::optional<float,_0>
                  (&local_5c4,(optional<float> *)((long)&d.contained + 4));
        nonstd::optional_lite::optional<float>::~optional
                  ((optional<float> *)((long)&d.contained + 4));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_5c4);
        if (bVar2) {
          pvVar13 = nonstd::optional_lite::optional<float>::value(&local_5c4);
          vStack_5b0 = (value_type)*pvVar13;
LAB_0024a13d:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<double>(&local_5f0,(XformOp *)(m.m[3] + 3),t,tinterp);
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_5e0,&local_5f0);
          nonstd::optional_lite::optional<double>::~optional(&local_5f0);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_5e0);
          if (bVar2) {
            pvVar14 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_5e0);
            vStack_5b0 = *pvVar14;
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              uVar15 = std::__cxx11::string::empty();
              if ((uVar15 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_630,"`xformOp:rotateX:{}` is not half, float or double type.\n",
                           (allocator *)((long)xe.m.m[3] + 0x1f));
                fmt::format<std::__cxx11::string>
                          (&local_610,(fmt *)local_630,(string *)&x,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                std::__cxx11::string::operator+=((string *)err,(string *)&local_610);
                std::__cxx11::string::~string((string *)&local_610);
                std::__cxx11::string::~string(local_630);
                std::allocator<char>::~allocator((allocator<char> *)((long)xe.m.m[3] + 0x1f));
              }
              else {
                std::__cxx11::string::operator+=
                          ((string *)err,"`xformOp:rotateX` is not half, float or double type.\n");
              }
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_5e0);
          if (sxf.contained._56_4_ == 0) goto LAB_0024a13d;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_5c4);
        if (sxf.contained._56_4_ == 0) goto LAB_0024a161;
      }
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_5b4);
      if (sxf.contained._56_4_ == 0) {
        anon_unknown_4::XformEvaluator::XformEvaluator
                  ((XformEvaluator *)
                   &ret.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        anon_unknown_4::XformEvaluator::RotateX
                  ((XformEvaluator *)
                   &ret.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value,vStack_5b0);
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&angle_1,
                   &ret.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)&angle_1);
        if (bVar2) {
          pvVar17 = nonstd::expected_lite::
                    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&angle_1);
          memcpy((void *)((long)&sxf.contained + 0x3c),pvVar17,0x80);
          sxf.contained._56_4_ = 5;
        }
        else {
          if (err != (string *)0x0) {
            peVar16 = nonstd::expected_lite::
                      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&angle_1);
            std::__cxx11::string::operator+=((string *)err,(string *)peVar16);
          }
          this_local._7_1_ = 0;
          sxf.contained._56_4_ = 1;
        }
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&angle_1);
        anon_unknown_4::XformEvaluator::~XformEvaluator
                  ((XformEvaluator *)
                   &ret.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
joined_r0x0024a8e0:
        if (sxf.contained._56_4_ == 5) goto switchD_0024941b_default;
      }
      break;
    case 4:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&f_1.contained,(XformOp *)(m.m[3] + 3),t,tinterp
                );
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_76c,(optional<tinyusdz::value::half> *)&f_1.contained);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional
                ((optional<tinyusdz::value::half> *)&f_1.contained);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_76c);
      if (bVar2) {
        pvVar12 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_76c);
        f_1._2_2_ = pvVar12->value;
        fVar18 = tinyusdz::value::half_to_float((half)f_1._2_2_);
        vStack_768 = (value_type)fVar18;
LAB_0024a4ad:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<float>
                  ((optional<float> *)((long)&d_1.contained + 4),(XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<float>::optional<float,_0>
                  (&local_77c,(optional<float> *)((long)&d_1.contained + 4));
        nonstd::optional_lite::optional<float>::~optional
                  ((optional<float> *)((long)&d_1.contained + 4));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_77c);
        if (bVar2) {
          pvVar13 = nonstd::optional_lite::optional<float>::value(&local_77c);
          vStack_768 = (value_type)*pvVar13;
LAB_0024a489:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<double>(&local_7a8,(XformOp *)(m.m[3] + 3),t,tinterp);
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_798,&local_7a8);
          nonstd::optional_lite::optional<double>::~optional(&local_7a8);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_798);
          if (bVar2) {
            pvVar14 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_798);
            vStack_768 = *pvVar14;
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              uVar15 = std::__cxx11::string::empty();
              if ((uVar15 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7e8,"`xformOp:rotateY:{}` is not half, float or double type.\n",
                           (allocator *)((long)xe_1.m.m[3] + 0x1f));
                fmt::format<std::__cxx11::string>
                          (&local_7c8,(fmt *)local_7e8,(string *)&x,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                std::__cxx11::string::operator+=((string *)err,(string *)&local_7c8);
                std::__cxx11::string::~string((string *)&local_7c8);
                std::__cxx11::string::~string(local_7e8);
                std::allocator<char>::~allocator((allocator<char> *)((long)xe_1.m.m[3] + 0x1f));
              }
              else {
                std::__cxx11::string::operator+=
                          ((string *)err,"`xformOp:rotateY` is not half, float or double type.\n");
              }
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_798);
          if (sxf.contained._56_4_ == 0) goto LAB_0024a489;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_77c);
        if (sxf.contained._56_4_ == 0) goto LAB_0024a4ad;
      }
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_76c);
      if (sxf.contained._56_4_ == 0) {
        anon_unknown_4::XformEvaluator::XformEvaluator
                  ((XformEvaluator *)
                   &ret_1.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        anon_unknown_4::XformEvaluator::RotateY
                  ((XformEvaluator *)
                   &ret_1.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value,vStack_768);
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&angle_2,
                   &ret_1.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)&angle_2);
        if (bVar2) {
          pvVar17 = nonstd::expected_lite::
                    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&angle_2);
          memcpy((void *)((long)&sxf.contained + 0x3c),pvVar17,0x80);
          sxf.contained._56_4_ = 5;
        }
        else {
          if (err != (string *)0x0) {
            peVar16 = nonstd::expected_lite::
                      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&angle_2);
            std::__cxx11::string::operator+=((string *)err,(string *)peVar16);
          }
          this_local._7_1_ = 0;
          sxf.contained._56_4_ = 1;
        }
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&angle_2);
        anon_unknown_4::XformEvaluator::~XformEvaluator
                  ((XformEvaluator *)
                   &ret_1.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        goto joined_r0x0024a8e0;
      }
      break;
    case 5:
      XformOp::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&f_2.contained,(XformOp *)(m.m[3] + 3),t,tinterp
                );
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_924,(optional<tinyusdz::value::half> *)&f_2.contained);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional
                ((optional<tinyusdz::value::half> *)&f_2.contained);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_924);
      if (bVar2) {
        pvVar12 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_924);
        f_2._2_2_ = pvVar12->value;
        fVar18 = tinyusdz::value::half_to_float((half)f_2._2_2_);
        vStack_920 = (value_type)fVar18;
LAB_0024a7f9:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<float>
                  ((optional<float> *)((long)&d_2.contained + 4),(XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<float>::optional<float,_0>
                  (&local_934,(optional<float> *)((long)&d_2.contained + 4));
        nonstd::optional_lite::optional<float>::~optional
                  ((optional<float> *)((long)&d_2.contained + 4));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_934);
        if (bVar2) {
          pvVar13 = nonstd::optional_lite::optional<float>::value(&local_934);
          vStack_920 = (value_type)*pvVar13;
LAB_0024a7d5:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<double>(&local_960,(XformOp *)(m.m[3] + 3),t,tinterp);
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_950,&local_960);
          nonstd::optional_lite::optional<double>::~optional(&local_960);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_950);
          if (bVar2) {
            pvVar14 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_950);
            vStack_920 = *pvVar14;
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              uVar15 = std::__cxx11::string::empty();
              if ((uVar15 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9a0,"`xformOp:rotateZ:{}` is not half, float or double type.\n",
                           (allocator *)((long)xe_2.m.m[3] + 0x1f));
                fmt::format<std::__cxx11::string>
                          (&local_980,(fmt *)local_9a0,(string *)&x,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                std::__cxx11::string::operator+=((string *)err,(string *)&local_980);
                std::__cxx11::string::~string((string *)&local_980);
                std::__cxx11::string::~string(local_9a0);
                std::allocator<char>::~allocator((allocator<char> *)((long)xe_2.m.m[3] + 0x1f));
              }
              else {
                std::__cxx11::string::operator+=
                          ((string *)err,"`xformOp:rotateZ` is not half, float or double type.\n");
              }
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_950);
          if (sxf.contained._56_4_ == 0) goto LAB_0024a7d5;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_934);
        if (sxf.contained._56_4_ == 0) goto LAB_0024a7f9;
      }
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_924);
      if (sxf.contained._56_4_ == 0) {
        anon_unknown_4::XformEvaluator::XformEvaluator
                  ((XformEvaluator *)
                   &ret_2.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        anon_unknown_4::XformEvaluator::RotateZ
                  ((XformEvaluator *)
                   &ret_2.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value,vStack_920);
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(rm.m[2] + 2),
                   &ret_2.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)(rm.m[2] + 2));
        if (bVar2) {
          pvVar17 = nonstd::expected_lite::
                    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(rm.m[2] + 2));
          memcpy((void *)((long)&sxf.contained + 0x3c),pvVar17,0x80);
          sxf.contained._56_4_ = 5;
        }
        else {
          if (err != (string *)0x0) {
            peVar16 = nonstd::expected_lite::
                      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(rm.m[2] + 2));
            std::__cxx11::string::operator+=((string *)err,(string *)peVar16);
          }
          this_local._7_1_ = 0;
          sxf.contained._56_4_ = 1;
        }
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(rm.m[2] + 2));
        anon_unknown_4::XformEvaluator::~XformEvaluator
                  ((XformEvaluator *)
                   &ret_2.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        goto joined_r0x0024a8e0;
      }
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
      const::$_0::operator()::XformOp_const___const
                ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e78,cm.m[3] + 3,(XformOp *)(m.m[3] + 3));
      bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_e78);
      if (bVar2) {
        pvVar17 = nonstd::expected_lite::
                  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_e78);
        memcpy((void *)((long)&sxf.contained + 0x3c),pvVar17,0x80);
      }
      else {
        peVar16 = nonstd::expected_lite::
                  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_e78);
        std::__cxx11::string::operator+=((string *)err,(string *)peVar16);
        this_local._7_1_ = 0;
      }
      sxf.contained._57_3_ = 0;
      sxf.contained._56_1_ = !bVar2;
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e78);
      if (sxf.contained._56_4_ != 0) break;
    default:
switchD_0024941b_default:
      tinyusdz::value::operator*
                (&local_ef8,(matrix4d *)((long)&sxf.contained + 0x3c),(matrix4d *)&i);
      memcpy(&i,&local_ef8,0x80);
      sxf.contained._56_4_ = 0;
      break;
    case 0xc:
      tinyusdz::value::matrix3d::matrix3d((matrix3d *)&h_3.contained);
      XformOp::get_value<tinyusdz::value::quath>(&local_b2c,(XformOp *)(m.m[3] + 3),t,tinterp);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
                ((optional<tinyusdz::value::quath> *)local_b22,&local_b2c);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_b2c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b22);
      if (bVar2) {
        q = nonstd::optional_lite::optional<tinyusdz::value::quath>::value
                      ((optional<tinyusdz::value::quath> *)local_b22);
        to_matrix3x3((matrix3d *)((long)&f_3.contained + 8),q);
        memcpy(&h_3.contained,(void *)((long)&f_3.contained + 8),0x48);
LAB_0024ab88:
        sxf.contained._56_4_ = 0;
      }
      else {
        XformOp::get_value<tinyusdz::value::quatf>(&local_ba0,(XformOp *)(m.m[3] + 3),t,tinterp);
        nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional<tinyusdz::value::quatf,_0>
                  ((optional<tinyusdz::value::quatf> *)local_b8c,&local_ba0);
        nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional(&local_ba0);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b8c);
        if (bVar2) {
          q_00 = nonstd::optional_lite::optional<tinyusdz::value::quatf>::value
                           ((optional<tinyusdz::value::quatf> *)local_b8c);
          to_matrix3x3((matrix3d *)((long)&d_3.contained + 0x18),q_00);
          memcpy(&h_3.contained,(void *)((long)&d_3.contained + 0x18),0x48);
LAB_0024ab64:
          sxf.contained._56_4_ = 0;
        }
        else {
          XformOp::get_value<tinyusdz::value::quatd>(&local_c38,(XformOp *)(m.m[3] + 3),t,tinterp);
          nonstd::optional_lite::optional<tinyusdz::value::quatd>::
          optional<tinyusdz::value::quatd,_0>
                    ((optional<tinyusdz::value::quatd> *)local_c10,&local_c38);
          nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_c38);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c10);
          if (bVar2) {
            q_01 = nonstd::optional_lite::optional<tinyusdz::value::quatd>::value
                             ((optional<tinyusdz::value::quatd> *)local_c10);
            to_matrix3x3(&local_c80,q_01);
            memcpy(&h_3.contained,&local_c80,0x48);
            sxf.contained._56_4_ = 0;
          }
          else {
            if (err != (string *)0x0) {
              uVar15 = std::__cxx11::string::empty();
              if ((uVar15 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_cc0,"`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                           (allocator *)((long)inv_rm.m[2] + 0x17));
                fmt::format<std::__cxx11::string>
                          (&local_ca0,(fmt *)local_cc0,(string *)&x,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                std::__cxx11::string::operator+=((string *)err,(string *)&local_ca0);
                std::__cxx11::string::~string((string *)&local_ca0);
                std::__cxx11::string::~string(local_cc0);
                std::allocator<char>::~allocator((allocator<char> *)((long)inv_rm.m[2] + 0x17));
              }
              else {
                std::__cxx11::string::operator+=
                          ((string *)err,"`xformOp:orient` is not quath, quatf or quatd type.\n");
              }
            }
            this_local._7_1_ = 0;
            sxf.contained._56_4_ = 1;
          }
          nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional
                    ((optional<tinyusdz::value::quatd> *)local_c10);
          if (sxf.contained._56_4_ == 0) goto LAB_0024ab64;
        }
        nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional
                  ((optional<tinyusdz::value::quatf> *)local_b8c);
        if (sxf.contained._56_4_ == 0) goto LAB_0024ab88;
      }
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
                ((optional<tinyusdz::value::quath> *)local_b22);
      if (sxf.contained._56_4_ != 0) break;
      if ((m.m[3][3]._4_1_ & 1) != 0) {
        tinyusdz::value::matrix3d::matrix3d((matrix3d *)local_d10);
        bVar2 = inverse((matrix3d *)&h_3.contained,(matrix3d *)local_d10,0.0);
        if ((!bVar2) && (err != (string *)0x0)) {
          uVar15 = std::__cxx11::string::empty();
          if ((uVar15 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_d50,"`xformOp:orient:{}` is singular and cannot be inverted.\n",
                       &local_d51);
            fmt::format<std::__cxx11::string>
                      (&local_d30,(fmt *)local_d50,(string *)&x,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::__cxx11::string::operator+=((string *)err,(string *)&local_d30);
            std::__cxx11::string::~string((string *)&local_d30);
            std::__cxx11::string::~string(local_d50);
            std::allocator<char>::~allocator((allocator<char> *)&local_d51);
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)err,"`xformOp:orient` is singular and cannot be inverted.\n");
          }
        }
        memcpy(&h_3.contained,local_d10,0x48);
      }
      memset(&ret_3.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value,0,0x18);
      ret_3.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      ret_3.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._129_7_ = 0;
      to_matrix(&local_dd8,(matrix3d *)&h_3.contained,
                (double3 *)
                &ret_3.contained.
                 super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .m_has_value);
      memcpy((void *)((long)&sxf.contained + 0x3c),&local_dd8,0x80);
      goto switchD_0024941b_default;
    case 0xd:
      if (x._104_8_ != 0) {
        if (err != (string *)0x0) {
          std::__cxx11::string::operator+=
                    ((string *)err,
                     "!resetXformStack! should only appear at the first element of xformOps\n");
        }
        this_local._7_1_ = 0;
        sxf.contained._56_4_ = 1;
        break;
      }
      if (resetXformStack != (bool *)0x0) {
        *resetXformStack = true;
      }
      goto switchD_0024941b_default;
    }
    XformOp::~XformOp((XformOp *)(m.m[3] + 3));
    if (sxf.contained._56_4_ != 0) goto LAB_0024ae3e;
  }
  memcpy(out_matrix,&i,0x80);
  this_local._7_1_ = 1;
LAB_0024ae3e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Xformable::EvaluateXformOps(double t,
                                 value::TimeSampleInterpolationType tinterp,
                                 value::matrix4d *out_matrix,
                                 bool *resetXformStack,
                                 std::string *err) const {
  const auto RotateABC =
      [t, tinterp](const XformOp &x) -> nonstd::expected<value::matrix4d, std::string> {
    value::double3 v;
    if (auto h = x.get_value<value::half3>(t, tinterp)) {
      v[0] = double(half_to_float(h.value()[0]));
      v[1] = double(half_to_float(h.value()[1]));
      v[2] = double(half_to_float(h.value()[2]));
    } else if (auto f = x.get_value<value::float3>(t, tinterp)) {
      v[0] = double(f.value()[0]);
      v[1] = double(f.value()[1]);
      v[2] = double(f.value()[2]);
    } else if (auto d = x.get_value<value::double3>(t, tinterp)) {
      v = d.value();
    } else {
      if (x.suffix.empty()) {
        return nonstd::make_unexpected(
            fmt::format("`{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type)));
      } else {
        return nonstd::make_unexpected(
            fmt::format("`{}:{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type), x.suffix));
      }
    }

    // invert input, and compute concatenated matrix
    // inv(ABC) = inv(A) x inv(B) x inv(C)
    // as done in pxrUSD.

    if (x.inverted) {
      v[0] = -v[0];
      v[1] = -v[1];
      v[2] = -v[2];
    }

    double xAngle = v[0];
    double yAngle = v[1];
    double zAngle = v[2];

    XformEvaluator eval;

    DCOUT("angles = " << xAngle << ", " << yAngle << ", " << zAngle);
    if (x.inverted) {
      DCOUT("!inverted!\n");
      if (x.op_type == XformOp::OpType::RotateXYZ) {
        // TODO: Apply defined switch for all Rotate*** op.
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    } else {
      if (x.op_type == XformOp::OpType::RotateXYZ) {

#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    }

    return eval.result();
  };

  // Concat matrices
  //
  // Matrix concatenation ordering is its appearance order(right to left)
  // This is same with a notation in math equation: i.e,
  //
  // xformOpOrder = [A, B, C]
  //
  // M = A x B x C
  //
  // p' = A x B x C x p
  //
  // in post-multiply order.
  //
  // But in pre-multiply order system(pxrUSD and TinyUSDZ),
  // C++ code is
  //
  // p' = p x C x B x A
  //
  //
  value::matrix4d cm;
  Identity(&cm);

  for (size_t i = 0; i < xformOps.size(); i++) {
    const auto x = xformOps[i];

    value::matrix4d m;  // local matrix
    Identity(&m);

    switch (x.op_type) {
      case XformOp::OpType::ResetXformStack: {
        if (i != 0) {
          if (err) {
            (*err) +=
                "!resetXformStack! should only appear at the first element of "
                "xformOps\n";
          }
          return false;
        }

        // Notify resetting previous(parent node's) matrices
        if (resetXformStack) {
          (*resetXformStack) = true;
        }
        break;
      }
      case XformOp::OpType::Transform: {
        if (auto sxf = x.get_value<value::matrix4f>(t, tinterp)) {
          value::matrix4f mf = sxf.value();
          for (size_t j = 0; j < 4; j++) {
            for (size_t k = 0; k < 4; k++) {
              m.m[j][k] = double(mf.m[j][k]);
            }
          }
        } else if (auto sxd = x.get_value<value::matrix4d>(t, tinterp)) {
          m = sxd.value();
        } else {
          if (err) {
            (*err) += "`xformOp:transform` is not matrix4f or matrix4d type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // Singular check.
          // pxrUSD uses 1e-9
          double det = determinant(m);

          if (std::fabs(det) < 1e-9) {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:transform` is singular matrix and cannot be "
                    "inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:transform:{}` is singular matrix and cannot be "
                    "inverted.\n",
                    x.suffix);
              }
            }

            return false;
          }

          m = inverse(m);
        }

        break;
      }
      case XformOp::OpType::Scale: {
        double sx, sy, sz;

        if (auto sxh = x.get_value<value::half3>(t, tinterp)) {
          sx = double(half_to_float(sxh.value()[0]));
          sy = double(half_to_float(sxh.value()[1]));
          sz = double(half_to_float(sxh.value()[2]));
        } else if (auto sxf = x.get_value<value::float3>(t, tinterp)) {
          sx = double(sxf.value()[0]);
          sy = double(sxf.value()[1]);
          sz = double(sxf.value()[2]);
        } else if (auto sxd = x.get_value<value::double3>(t, tinterp)) {
          sx = sxd.value()[0];
          sy = sxd.value()[1];
          sz = sxd.value()[2];
        } else {
          if (err) {
            (*err) += "`xformOp:scale` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // FIXME: Safe division
          sx = 1.0 / sx;
          sy = 1.0 / sy;
          sz = 1.0 / sz;
        }

        m.m[0][0] = sx;
        m.m[1][1] = sy;
        m.m[2][2] = sz;

        break;
      }
      case XformOp::OpType::Translate: {
        double tx, ty, tz;
        if (auto txh = x.get_value<value::half3>(t, tinterp)) {
          tx = double(half_to_float(txh.value()[0]));
          ty = double(half_to_float(txh.value()[1]));
          tz = double(half_to_float(txh.value()[2]));
        } else if (auto txf = x.get_value<value::float3>(t, tinterp)) {
          tx = double(txf.value()[0]);
          ty = double(txf.value()[1]);
          tz = double(txf.value()[2]);
        } else if (auto txd = x.get_value<value::double3>(t, tinterp)) {
          tx = txd.value()[0];
          ty = txd.value()[1];
          tz = txd.value()[2];
        } else {
          if (err) {
            (*err) +=
                "`xformOp:translate` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          tx = -tx;
          ty = -ty;
          tz = -tz;
        }

        m.m[3][0] = tx;
        m.m[3][1] = ty;
        m.m[3][2] = tz;

        break;
      }
      // FIXME: Validate ROTATE_X, _Y, _Z implementation
      case XformOp::OpType::RotateX: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateX` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateX:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({1.0, 0.0, 0.0}, angle);
#else
        xe.RotateX(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateY: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateY` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateY:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 1.0, 0.0}, angle);
#else
        xe.RotateY(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateZ: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateZ` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateZ:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 0.0, 1.0}, angle);
#else
        xe.RotateZ(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::Orient: {
        // value::quat stores elements in (x, y, z, w)
        // linalg::quat also stores elements in (x, y, z, w)

        value::matrix3d rm;
        if (auto h = x.get_value<value::quath>(t, tinterp)) {
          rm = to_matrix3x3(h.value());
        } else if (auto f = x.get_value<value::quatf>(t, tinterp)) {
          rm = to_matrix3x3(f.value());
        } else if (auto d = x.get_value<value::quatd>(t, tinterp)) {
          rm = to_matrix3x3(d.value());
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) += "`xformOp:orient` is not quath, quatf or quatd type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        // FIXME: invert before getting matrix.
        if (x.inverted) {
          value::matrix3d inv_rm;
          if (inverse(rm, inv_rm)) {
          } else {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:orient` is singular and cannot be inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:orient:{}` is singular and cannot be inverted.\n",
                    x.suffix);
              }
            }
          }

          rm = inv_rm;
        }

        m = to_matrix(rm, {0.0, 0.0, 0.0});

        break;
      }

      case XformOp::OpType::RotateXYZ:
      case XformOp::OpType::RotateXZY:
      case XformOp::OpType::RotateYXZ:
      case XformOp::OpType::RotateYZX:
      case XformOp::OpType::RotateZXY:
      case XformOp::OpType::RotateZYX: {
        auto ret = RotateABC(x);

        if (!ret) {
          (*err) += ret.error();
          return false;
        }

        m = ret.value();
      }
    }

    cm = m * cm;  // `m` fist for pre-multiply system.
  }

  (*out_matrix) = cm;

  return true;
}